

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::parse(JSON *this,string *s)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  undefined1 local_41f0 [8];
  JSONParser jp;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  BufferInputSource bis;
  string *s_local;
  
  bis.max_offset = (qpdf_offset_t)s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"json input",&local_121);
  BufferInputSource::BufferInputSource
            ((BufferInputSource *)local_100,&local_120,(string *)bis.max_offset);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  anon_unknown.dwarf_3c45b::JSONParser::JSONParser
            ((JSONParser *)local_41f0,(InputSource *)local_100,(Reactor *)0x0);
  anon_unknown.dwarf_3c45b::JSONParser::parse((JSONParser *)this);
  anon_unknown.dwarf_3c45b::JSONParser::~JSONParser((JSONParser *)local_41f0);
  BufferInputSource::~BufferInputSource((BufferInputSource *)local_100);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::parse(std::string const& s)
{
    BufferInputSource bis("json input", s);
    JSONParser jp(bis, nullptr);
    return jp.parse();
}